

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetTenor
          (FXBase *this,string *tenor_key,string *settlement_key,Tenor *tenor)

{
  size_t __n;
  FX *pFVar1;
  bool bVar2;
  int iVar3;
  Tenor *pTVar4;
  ostream *poVar5;
  InvalidSubjectException *pIVar6;
  string far_tenor;
  stringstream ss;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  Tenor::ToString_abi_cxx11_((string *)local_1b0,tenor);
  Tenor::ToString_abi_cxx11_(&local_1f0,(Tenor *)&Tenor::BROKEN_DATE);
  if (local_1b0._8_8_ == local_1f0._M_string_length) {
    if (local_1b0._8_8_ != 0) {
      iVar3 = bcmp((void *)local_1b0._0_8_,local_1f0._M_dataplus._M_p,local_1b0._8_8_);
      if (iVar3 != 0) goto LAB_0019efed;
    }
    bVar2 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       settlement_key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
                  settlement_key);
    }
  }
  else {
LAB_0019efed:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
  }
  __n = tenor_key->_M_string_length;
  if (__n == DAT_001ed478) {
    if (__n != 0) {
      iVar3 = bcmp((tenor_key->_M_dataplus)._M_p,SubjectKey::FAR_TENOR_abi_cxx11_,__n);
      if (iVar3 != 0) goto LAB_0019f0b2;
    }
    bVar2 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)&SubjectKey::TENOR_abi_cxx11_);
    if (!bVar2) goto LAB_0019f26a;
    SubjectBuilder::GetComponent
              (&local_1f0,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)&SubjectKey::TENOR_abi_cxx11_);
    pTVar4 = Tenor::GetTenorFromString(&local_1f0);
    bVar2 = Tenor::IsValidNearFarTenor(pTVar4,tenor);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Invalid near/far tenor combination: [TENOR] ",0x2c);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b0 + 0x10),local_1f0._M_dataplus._M_p,
                          local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," [FAR] ",7);
      Tenor::ToString_abi_cxx11_(&local_1d0,tenor);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_1d0);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  else {
LAB_0019f0b2:
    if (__n != DAT_001ed658) {
LAB_0019f2bb:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Invalid tenor key: ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),(tenor_key->_M_dataplus)._M_p,
                 tenor_key->_M_string_length);
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_1f0);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
    if (__n != 0) {
      iVar3 = bcmp((tenor_key->_M_dataplus)._M_p,SubjectKey::TENOR_abi_cxx11_,__n);
      if (iVar3 != 0) goto LAB_0019f2bb;
    }
    bVar2 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)&SubjectKey::FAR_TENOR_abi_cxx11_);
    if (!bVar2) goto LAB_0019f26a;
    SubjectBuilder::GetComponent
              (&local_1f0,
               &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
               (string *)&SubjectKey::FAR_TENOR_abi_cxx11_);
    pTVar4 = Tenor::GetTenorFromString(&local_1f0);
    bVar2 = Tenor::IsValidNearFarTenor(tenor,pTVar4);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),"Invalid near/far tenor combination: [TENOR] ",0x2c);
      Tenor::ToString_abi_cxx11_(&local_1d0,tenor);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b0 + 0x10),local_1d0._M_dataplus._M_p,
                          local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," [FAR] ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_1d0);
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
LAB_0019f26a:
  pFVar1 = this->outer_class_;
  Tenor::ToString_abi_cxx11_((string *)local_1b0,tenor);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,tenor_key,
             (string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetTenor(const std::string& tenor_key, const std::string& settlement_key, const Tenor& tenor)
{
    if (tenor.ToString() == Tenor::BROKEN_DATE.ToString() && !outer_class_.subject_builder_.ContainsKey(settlement_key))
    {
        outer_class_.AddMandatoryKey(settlement_key);
    }

    if (tenor_key == SubjectKey::FAR_TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::TENOR))
        {
            std::string near_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::TENOR);

            if (!Tenor::IsValidNearFarTenor(Tenor::GetTenorFromString(near_tenor), tenor))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  near_tenor << " [FAR] " << tenor.ToString();
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else if (tenor_key == SubjectKey::TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::FAR_TENOR))
        {
            std::string far_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::FAR_TENOR);

            if (!Tenor::IsValidNearFarTenor(tenor, Tenor::GetTenorFromString(far_tenor)))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  tenor.ToString() << " [FAR] " << far_tenor;
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else
    {
        std::stringstream ss;
        ss << "Invalid tenor key: " <<  tenor_key;
        throw InvalidSubjectException(ss.str());
    }

    outer_class_.subject_builder_.SetComponent(tenor_key, tenor.ToString());
}